

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChParticleCloud::ArchiveIN(ChParticleCloud *this,ChArchiveIn *marchive)

{
  pointer ppCVar1;
  pointer ppCVar2;
  uint j;
  ulong uVar3;
  ChNameValue<float> local_120;
  ChNameValue<float> local_108;
  ChNameValue<float> local_f0;
  ChNameValue<float> local_d8;
  ChNameValue<float> local_c0;
  ChNameValue<float> local_a8;
  ChNameValue<bool> local_90;
  ChNameValue<bool> local_78;
  ChNameValue<std::shared_ptr<chrono::ChMaterialSurface>_> local_60;
  ChNameValue<chrono::collision::ChCollisionModel_*> local_48;
  ChNameValue<std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChParticleCloud>(marchive);
  ChIndexedParticles::ArchiveIN(&this->super_ChIndexedParticles,marchive);
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xd])(this);
  local_30._value = &this->particles;
  local_30._name = "particles";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->particle_collision_model;
  local_48._name = "particle_collision_model";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->matsurface;
  local_60._name = "matsurface";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->do_collide;
  local_78._name = "do_collide";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->do_limit_speed;
  local_90._name = "do_limit_speed";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->max_speed;
  local_a8._name = "max_speed";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->max_wvel;
  local_c0._name = "max_wvel";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  local_d8._value = &this->sleep_time;
  local_d8._name = "sleep_time";
  local_d8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d8);
  local_f0._value = &this->sleep_minspeed;
  local_f0._name = "sleep_minspeed";
  local_f0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f0);
  local_108._value = &this->sleep_minwvel;
  local_108._name = "sleep_minwvel";
  local_108._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_108);
  local_120._value = &this->sleep_starttime;
  local_120._name = "sleep_starttime";
  local_120._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_120);
  ppCVar1 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (uVar3 = 0; uVar3 < (ulong)((long)ppCVar2 - (long)ppCVar1 >> 3);
      uVar3 = (ulong)((int)uVar3 + 1)) {
    ppCVar1[uVar3]->container = this;
  }
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xc])(this);
  return;
}

Assistant:

void ChParticleCloud::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChParticleCloud>();

    // deserialize parent class:
    ChIndexedParticles::ArchiveIN(marchive);

    // deserialize all member data:

    RemoveCollisionModelsFromSystem();

    marchive >> CHNVP(particles);
    // marchive >> CHNVP(particle_mass); //***TODO***
    marchive >> CHNVP(particle_collision_model);
    marchive >> CHNVP(matsurface);
    marchive >> CHNVP(do_collide);
    marchive >> CHNVP(do_limit_speed);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(max_wvel);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleep_starttime);

    for (unsigned int j = 0; j < particles.size(); j++) {
        particles[j]->SetContainer(this);
    }
    AddCollisionModelsToSystem();
}